

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

CallInfo * luaD_precall(lua_State *L,StkId func,int nresults)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  uint n;
  CallInfo *pCVar4;
  ptrdiff_t t__;
  int fsize;
  int nfixparams;
  int narg;
  Proto *p;
  CallInfo *ci;
  StkId pSStack_20;
  int nresults_local;
  StkId func_local;
  lua_State *L_local;
  
  pSStack_20 = func;
  while( true ) {
    bVar3 = (pSStack_20->val).tt_ & 0x3f;
    if (bVar3 == 6) {
      lVar1 = *(long *)((pSStack_20->val).value_.f + 0x18);
      fsize = (int)((long)(L->top).p - (long)pSStack_20 >> 4) + -1;
      bVar3 = *(byte *)(lVar1 + 10);
      n = (uint)*(byte *)(lVar1 + 0xc);
      if ((long)(L->stack_last).p - (L->top).offset >> 4 <= (long)(int)n) {
        lVar2 = (L->stack).offset;
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
        luaD_growstack(L,n,1);
        pSStack_20 = (StkId)((long)(L->stack).p + ((long)pSStack_20 - lVar2));
      }
      pCVar4 = prepCallInfo(L,pSStack_20,nresults,0,pSStack_20 + (long)(int)n + 1);
      L->ci = pCVar4;
      (pCVar4->u).l.savedpc = *(Instruction **)(lVar1 + 0x40);
      for (; fsize < (int)(uint)bVar3; fsize = fsize + 1) {
        lVar1 = (L->top).offset;
        (L->top).p = (StkId)(lVar1 + 0x10);
        *(undefined1 *)(lVar1 + 8) = 0;
      }
      return pCVar4;
    }
    if (bVar3 == 0x16) break;
    if (bVar3 == 0x26) {
      precallC(L,pSStack_20,nresults,*(lua_CFunction *)((pSStack_20->val).value_.f + 0x18));
      return (CallInfo *)0x0;
    }
    pSStack_20 = tryfuncTM(L,pSStack_20);
  }
  precallC(L,pSStack_20,nresults,(pSStack_20->val).value_.f);
  return (CallInfo *)0x0;
}

Assistant:

CallInfo *luaD_precall (lua_State *L, StkId func, int nresults) {
 retry:
  switch (ttypetag(s2v(func))) {
    case LUA_VCCL:  /* C closure */
      precallC(L, func, nresults, clCvalue(s2v(func))->f);
      return NULL;
    case LUA_VLCF:  /* light C function */
      precallC(L, func, nresults, fvalue(s2v(func)));
      return NULL;
    case LUA_VLCL: {  /* Lua function */
      CallInfo *ci;
      Proto *p = clLvalue(s2v(func))->p;
      int narg = cast_int(L->top.p - func) - 1;  /* number of real arguments */
      int nfixparams = p->numparams;
      int fsize = p->maxstacksize;  /* frame size */
      checkstackGCp(L, fsize, func);
      L->ci = ci = prepCallInfo(L, func, nresults, 0, func + 1 + fsize);
      ci->u.l.savedpc = p->code;  /* starting point */
      for (; narg < nfixparams; narg++)
        setnilvalue(s2v(L->top.p++));  /* complete missing arguments */
      lua_assert(ci->top.p <= L->stack_last.p);
      return ci;
    }
    default: {  /* not a function */
      func = tryfuncTM(L, func);  /* try to get '__call' metamethod */
      /* return luaD_precall(L, func, nresults); */
      goto retry;  /* try again with metamethod */
    }
  }
}